

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moneystr.cpp
# Opt level: O3

optional<long> ParseMoney(string *money_string)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long *plVar2;
  bool bVar3;
  byte bVar4;
  undefined1 *puVar5;
  void *pvVar6;
  size_type sVar7;
  long lVar8;
  undefined8 uVar9;
  pointer pcVar10;
  byte *pbVar11;
  pointer unaff_RBP;
  size_type __pos;
  ulong uVar12;
  ulong uVar13;
  _Storage<long,_true> unaff_R15;
  long in_FS_OFFSET;
  string_view str_00;
  optional<long> oVar14;
  string strWhole;
  string str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  long *local_58;
  long local_50;
  long local_48 [2];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)money_string->_M_string_length;
  if (paVar1 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0) {
    plVar2 = (long *)(money_string->_M_dataplus)._M_p;
    puVar5 = (undefined1 *)0x0;
    do {
      if (*(char *)((long)plVar2 + (long)puVar5) == '\0') {
        uVar13 = 0;
        goto LAB_003f9761;
      }
      puVar5 = puVar5 + 1;
    } while (paVar1 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)puVar5);
    pcVar10 = (pointer)0x0;
    local_78._M_dataplus._M_p = (pointer)paVar1;
    local_78._M_string_length = (size_type)plVar2;
    do {
      pvVar6 = memchr(" \f\n\r\t\v",(int)*(char *)((long)plVar2 + (long)pcVar10),6);
      if (pvVar6 == (void *)0x0) {
        if (pcVar10 != (pointer)0xffffffffffffffff) {
          sVar7 = std::basic_string_view<char,_std::char_traits<char>_>::find_last_not_of
                            ((basic_string_view<char,_std::char_traits<char>_> *)&local_78,
                             " \f\n\r\t\v",0xffffffffffffffff,6);
          if (local_78._M_dataplus._M_p < pcVar10) {
            if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
              uVar9 = std::__throw_out_of_range_fmt
                                ("%s: __pos (which is %zu) > __size (which is %zu)",
                                 "basic_string_view::substr",pcVar10);
              if (local_78._M_dataplus._M_p != unaff_RBP) {
                operator_delete(local_78._M_dataplus._M_p,
                                CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,
                                         local_78.field_2._M_local_buf[0]) + 1);
              }
              if (local_58 != plVar2) {
                operator_delete(local_58,local_48[0] + 1);
              }
              if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                _Unwind_Resume(uVar9);
              }
            }
            goto LAB_003f9804;
          }
          uVar13 = (sVar7 - (long)pcVar10) + 1;
          if ((ulong)((long)local_78._M_dataplus._M_p - (long)pcVar10) < uVar13) {
            uVar13 = (long)local_78._M_dataplus._M_p - (long)pcVar10;
          }
          pcVar10 = pcVar10 + local_78._M_string_length;
          goto LAB_003f95de;
        }
        break;
      }
      pcVar10 = pcVar10 + 1;
    } while (paVar1 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)pcVar10);
  }
  uVar13 = 0;
  pcVar10 = (pointer)0x0;
LAB_003f95de:
  unaff_R15._M_value = (long)&local_58;
  local_58 = local_48;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)unaff_R15._M_value,pcVar10,pcVar10 + uVar13);
  if (local_50 != 0) {
    local_78._M_string_length = 0;
    local_78.field_2._M_local_buf[0] = '\0';
    pbVar11 = (byte *)((long)local_58 + 2);
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    do {
      bVar4 = pbVar11[-2];
      uVar13 = 0;
      if (bVar4 < 0x20) {
        if (bVar4 - 9 < 5) goto LAB_003f9731;
        if (bVar4 == 0) {
          if (local_78._M_string_length < (long *)0xb) {
            uVar12 = 0;
            goto LAB_003f970d;
          }
          goto LAB_003f96f4;
        }
      }
      else {
        if (bVar4 == 0x20) goto LAB_003f9731;
        if (bVar4 == 0x2e) {
          bVar4 = pbVar11[-1];
          if (9 < (byte)(bVar4 - 0x30)) {
            uVar12 = 0;
            goto LAB_003f96ed;
          }
          uVar12 = 0;
          uVar13 = 10000000;
          goto LAB_003f96a2;
        }
      }
      if (9 < (byte)(bVar4 - 0x30)) goto LAB_003f96f4;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      _M_replace_aux(&local_78,local_78._M_string_length,0,1,bVar4);
      pbVar11 = pbVar11 + 1;
    } while( true );
  }
  uVar13 = 0;
  goto LAB_003f974c;
  while( true ) {
    pbVar11 = pbVar11 + 1;
    bVar3 = uVar13 < 10;
    uVar13 = uVar13 / 10;
    if (bVar3) break;
LAB_003f96a2:
    uVar12 = ((ulong)bVar4 - 0x30) * uVar13 + uVar12;
    bVar4 = *pbVar11;
    if (9 < (byte)(bVar4 - 0x30)) break;
  }
LAB_003f96ed:
  if ((bVar4 == 0) && (uVar13 = 0, local_78._M_string_length < (long *)0xb)) {
    if (uVar12 < 0x5f5e101) {
LAB_003f970d:
      str_00._M_str = local_78._M_dataplus._M_p;
      str_00._M_len = local_78._M_string_length;
      lVar8 = LocaleIndependentAtoi<long>(str_00);
      unaff_R15._M_value = lVar8 * 100000000 + uVar12;
      uVar13 = (ulong)((ulong)unaff_R15 < 0x775f05a074001);
    }
  }
  else {
LAB_003f96f4:
    uVar13 = 0;
  }
LAB_003f9731:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,
                    CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,
                             local_78.field_2._M_local_buf[0]) + 1);
  }
LAB_003f974c:
  if (local_58 != local_48) {
    operator_delete(local_58,local_48[0] + 1);
  }
LAB_003f9761:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    oVar14.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
    _8_8_ = uVar13;
    oVar14.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
    _M_payload._M_value = unaff_R15._M_value;
    return (optional<long>)
           oVar14.super__Optional_base<long,_true,_true>._M_payload.
           super__Optional_payload_base<long>;
  }
LAB_003f9804:
  __stack_chk_fail();
}

Assistant:

std::optional<CAmount> ParseMoney(const std::string& money_string)
{
    if (!ContainsNoNUL(money_string)) {
        return std::nullopt;
    }
    const std::string str = TrimString(money_string);
    if (str.empty()) {
        return std::nullopt;
    }

    std::string strWhole;
    int64_t nUnits = 0;
    const char* p = str.c_str();
    for (; *p; p++)
    {
        if (*p == '.')
        {
            p++;
            int64_t nMult = COIN / 10;
            while (IsDigit(*p) && (nMult > 0))
            {
                nUnits += nMult * (*p++ - '0');
                nMult /= 10;
            }
            break;
        }
        if (IsSpace(*p))
            return std::nullopt;
        if (!IsDigit(*p))
            return std::nullopt;
        strWhole.insert(strWhole.end(), *p);
    }
    if (*p) {
        return std::nullopt;
    }
    if (strWhole.size() > 10) // guard against 63 bit overflow
        return std::nullopt;
    if (nUnits < 0 || nUnits > COIN)
        return std::nullopt;
    int64_t nWhole = LocaleIndependentAtoi<int64_t>(strWhole);
    CAmount value = nWhole * COIN + nUnits;

    if (!MoneyRange(value)) {
        return std::nullopt;
    }

    return value;
}